

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::PushItemFlag(ImGuiItemFlags option,bool enabled)

{
  int *piVar1;
  int iVar2;
  int *piVar3;
  uint uVar4;
  ImGuiContext *pIVar5;
  int *__dest;
  int iVar6;
  undefined7 in_register_00000031;
  ImGuiContext *ctx;
  int iVar7;
  
  pIVar5 = GImGui;
  uVar4 = GImGui->CurrentItemFlags | option;
  if ((int)CONCAT71(in_register_00000031,enabled) == 0) {
    uVar4 = ~option & GImGui->CurrentItemFlags;
  }
  iVar7 = (GImGui->ItemFlagsStack).Size;
  GImGui->CurrentItemFlags = uVar4;
  iVar2 = (pIVar5->ItemFlagsStack).Capacity;
  if (iVar7 == iVar2) {
    iVar7 = iVar7 + 1;
    if (iVar2 == 0) {
      iVar6 = 8;
    }
    else {
      iVar6 = iVar2 / 2 + iVar2;
    }
    if (iVar7 < iVar6) {
      iVar7 = iVar6;
    }
    if (iVar2 < iVar7) {
      if (pIVar5 != (ImGuiContext *)0x0) {
        piVar3 = &(pIVar5->IO).MetricsActiveAllocations;
        *piVar3 = *piVar3 + 1;
      }
      __dest = (int *)(*GImAllocatorAllocFunc)((long)iVar7 << 2,GImAllocatorUserData);
      piVar3 = (pIVar5->ItemFlagsStack).Data;
      if (piVar3 != (int *)0x0) {
        memcpy(__dest,piVar3,(long)(pIVar5->ItemFlagsStack).Size << 2);
        piVar3 = (pIVar5->ItemFlagsStack).Data;
        if ((piVar3 != (int *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + -1;
        }
        (*GImAllocatorFreeFunc)(piVar3,GImAllocatorUserData);
      }
      (pIVar5->ItemFlagsStack).Data = __dest;
      (pIVar5->ItemFlagsStack).Capacity = iVar7;
    }
  }
  (pIVar5->ItemFlagsStack).Data[(pIVar5->ItemFlagsStack).Size] = uVar4;
  (pIVar5->ItemFlagsStack).Size = (pIVar5->ItemFlagsStack).Size + 1;
  return;
}

Assistant:

void ImGui::PushItemFlag(ImGuiItemFlags option, bool enabled)
{
    ImGuiContext& g = *GImGui;
    ImGuiItemFlags item_flags = g.CurrentItemFlags;
    IM_ASSERT(item_flags == g.ItemFlagsStack.back());
    if (enabled)
        item_flags |= option;
    else
        item_flags &= ~option;
    g.CurrentItemFlags = item_flags;
    g.ItemFlagsStack.push_back(item_flags);
}